

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O1

void encrypt_cpa(uint8_t *out,public_key *pub,uint8_t *message,uint8_t *randomness)

{
  uint16_t uVar1;
  int i_2;
  ushort *puVar2;
  ulong uVar3;
  byte bVar4;
  int i;
  long lVar5;
  long lVar6;
  scalar *out_00;
  scalar *psVar7;
  int j;
  long lVar8;
  uint8_t *out_01;
  bool bVar9;
  uint8_t input [33];
  scalar v;
  scalar expanded_message;
  vector u;
  scalar scalar_error;
  vector secret;
  vector error;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined1 local_1848;
  scalar local_1838;
  ushort local_1638 [256];
  vector local_1438;
  scalar local_e38;
  vector local_c38;
  vector local_638;
  
  local_638.v[0].c._0_8_ = *(undefined8 *)randomness;
  local_638.v[0].c._8_8_ = *(undefined8 *)(randomness + 8);
  local_638.v[0].c._16_8_ = *(undefined8 *)(randomness + 0x10);
  local_638.v[0].c._24_8_ = *(undefined8 *)(randomness + 0x18);
  out_00 = local_638.v;
  psVar7 = local_c38.v;
  lVar5 = 0;
  do {
    lVar8 = lVar5 + 1;
    local_638.v[0].c[0x10]._0_1_ = (undefined1)lVar5;
    scalar_centered_binomial_distribution_eta_2_with_prf(psVar7,(uint8_t *)out_00);
    psVar7 = psVar7 + 1;
    lVar5 = lVar8;
  } while (lVar8 != 3);
  vector_ntt(&local_c38);
  local_1438.v[0].c._0_8_ = *(undefined8 *)randomness;
  local_1438.v[0].c._8_8_ = *(undefined8 *)(randomness + 8);
  local_1438.v[0].c._16_8_ = *(undefined8 *)(randomness + 0x10);
  local_1438.v[0].c._24_8_ = *(undefined8 *)(randomness + 0x18);
  psVar7 = local_1438.v;
  lVar5 = -3;
  do {
    local_1438.v[0].c[0x10]._0_1_ = (char)lVar5 + '\x06';
    scalar_centered_binomial_distribution_eta_2_with_prf(out_00,(uint8_t *)psVar7);
    out_00 = out_00 + 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  local_1868 = *(undefined8 *)randomness;
  uStack_1860 = *(undefined8 *)(randomness + 8);
  local_1858 = *(undefined8 *)(randomness + 0x10);
  uStack_1850 = *(undefined8 *)(randomness + 0x18);
  local_1848 = 6;
  scalar_centered_binomial_distribution_eta_2_with_prf(&local_e38,(uint8_t *)&local_1868);
  lVar5 = 0;
  memset(psVar7,0,0x600);
  do {
    lVar8 = 0;
    do {
      scalar_mult(&local_1838,(pub->m).v[lVar5] + lVar8,local_c38.v + lVar8);
      lVar6 = 0;
      do {
        uVar1 = reduce_once(local_1838.c[lVar6] + ((scalar *)psVar7->c)->c[lVar6]);
        ((scalar *)psVar7->c)->c[lVar6] = uVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x100);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar5 = lVar5 + 1;
    psVar7 = psVar7 + 1;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    scalar_inverse_ntt((scalar *)((long)local_1438.v[0].c + lVar5));
    lVar5 = lVar5 + 0x200;
  } while (lVar5 != 0x600);
  vector_add(&local_1438,&local_638);
  scalar_inner_product(&local_1838,&pub->t,&local_c38);
  scalar_inverse_ntt(&local_1838);
  lVar5 = 0;
  do {
    uVar1 = reduce_once(local_e38.c[lVar5] + local_1838.c[lVar5]);
    local_1838.c[lVar5] = uVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  puVar2 = local_1638;
  uVar3 = 0;
  do {
    bVar4 = *message;
    lVar5 = 0;
    do {
      puVar2[lVar5] = (ushort)(bVar4 & 1);
      bVar4 = bVar4 >> 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    message = message + 1;
    puVar2 = puVar2 + 8;
    bVar9 = uVar3 < 0xf8;
    uVar3 = uVar3 + 8;
  } while (bVar9);
  lVar5 = 0;
  do {
    local_1638[lVar5] =
         (short)((uint)local_1638[lVar5] * 0xd01 >> 1) +
         ((ushort)((uint)local_1638[lVar5] * 0xd01) & 1);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    uVar1 = reduce_once(local_1638[lVar5] + local_1838.c[lVar5]);
    local_1838.c[lVar5] = uVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    scalar_compress((scalar *)((long)local_1438.v[0].c + lVar5),10);
    lVar5 = lVar5 + 0x200;
  } while (lVar5 != 0x600);
  lVar5 = 0;
  out_01 = out;
  do {
    scalar_encode(out_01,(scalar *)((long)local_1438.v[0].c + lVar5),10);
    out_01 = out_01 + 0x140;
    lVar5 = lVar5 + 0x200;
  } while (lVar5 != 0x600);
  scalar_compress(&local_1838,4);
  scalar_encode(out + 0x3c0,&local_1838,4);
  return;
}

Assistant:

static void encrypt_cpa(uint8_t out[KYBER_CIPHERTEXT_BYTES],
                        const struct public_key *pub, const uint8_t message[32],
                        const uint8_t randomness[32]) {
  uint8_t counter = 0;
  vector secret;
  vector_generate_secret_eta_2(&secret, &counter, randomness);
  vector_ntt(&secret);
  vector error;
  vector_generate_secret_eta_2(&error, &counter, randomness);
  uint8_t input[33];
  OPENSSL_memcpy(input, randomness, 32);
  input[32] = counter;
  scalar scalar_error;
  scalar_centered_binomial_distribution_eta_2_with_prf(&scalar_error, input);
  vector u;
  matrix_mult(&u, &pub->m, &secret);
  vector_inverse_ntt(&u);
  vector_add(&u, &error);
  scalar v;
  scalar_inner_product(&v, &pub->t, &secret);
  scalar_inverse_ntt(&v);
  scalar_add(&v, &scalar_error);
  scalar expanded_message;
  scalar_decode_1(&expanded_message, message);
  scalar_decompress(&expanded_message, 1);
  scalar_add(&v, &expanded_message);
  vector_compress(&u, kDU);
  vector_encode(out, &u, kDU);
  scalar_compress(&v, kDV);
  scalar_encode(out + kCompressedVectorSize, &v, kDV);
}